

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetPropertyDescriptor
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor)

{
  bool bVar1;
  ScriptContext *requestContext_00;
  Var pvVar2;
  Var setter;
  ScriptContext *requestContext;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *object_local;
  
  bVar1 = PropertyDescriptor::ValueSpecified(descriptor);
  if (bVar1) {
    requestContext_00 = RecyclableObject::GetScriptContext(object);
    pvVar2 = PropertyDescriptor::GetValue(descriptor);
    SetProperty(object,object,propId,pvVar2,requestContext_00,PropertyOperation_None);
  }
  else {
    bVar1 = PropertyDescriptor::GetterSpecified(descriptor);
    if ((bVar1) || (bVar1 = PropertyDescriptor::SetterSpecified(descriptor), bVar1)) {
      pvVar2 = PropertyDescriptor::GetGetter(descriptor);
      setter = PropertyDescriptor::GetSetter(descriptor);
      SetAccessors(object,propId,pvVar2,setter,PropertyOperation_None);
    }
  }
  bVar1 = PropertyDescriptor::EnumerableSpecified(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::IsEnumerable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,(ulong)(uint)propId,(ulong)bVar1);
  }
  bVar1 = PropertyDescriptor::ConfigurableSpecified(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::IsConfigurable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,(ulong)(uint)propId,(ulong)bVar1);
  }
  bVar1 = PropertyDescriptor::WritableSpecified(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::IsWritable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3b])(object,(ulong)(uint)propId,(ulong)bVar1);
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::SetPropertyDescriptor(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor)
    {
        if (descriptor.ValueSpecified())
        {
            ScriptContext* requestContext = object->GetScriptContext(); // Real requestContext?
            JavascriptOperators::SetProperty(object, object, propId, descriptor.GetValue(), requestContext);
        }
        else if (descriptor.GetterSpecified() || descriptor.SetterSpecified())
        {
            JavascriptOperators::SetAccessors(object, propId, descriptor.GetGetter(), descriptor.GetSetter());
        }

        if (descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.IsEnumerable());
        }
        if (descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.IsConfigurable());
        }
        if (descriptor.WritableSpecified())
        {
            object->SetWritable(propId, descriptor.IsWritable());
        }

        return true;
    }